

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O0

shared_ptr<gui::Panel> gui::Panel::create(shared_ptr<gui::PanelStyle> *style,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<gui::Panel> sVar1;
  element_type *this;
  String *name_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  Panel *in_stack_ffffffffffffffd0;
  String local_28;
  
  this = in_RDI;
  operator_new(0x220);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc8);
  name_00 = &local_28;
  std::shared_ptr<gui::PanelStyle>::shared_ptr
            ((shared_ptr<gui::PanelStyle> *)this,(shared_ptr<gui::PanelStyle> *)in_RDI);
  Panel(in_stack_ffffffffffffffd0,
        (shared_ptr<gui::PanelStyle> *)CONCAT44(in_stack_ffffffffffffffcc,uVar2),name_00);
  std::shared_ptr<gui::Panel>::shared_ptr<gui::Panel,void>((shared_ptr<gui::Panel> *)this,in_RDI);
  std::shared_ptr<gui::PanelStyle>::~shared_ptr((shared_ptr<gui::PanelStyle> *)0x1d3766);
  sVar1.super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::Panel>)sVar1.super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Panel> Panel::create(std::shared_ptr<PanelStyle> style, const sf::String& name) {
    return std::shared_ptr<Panel>(new Panel(style, name));
}